

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void connectWarning(QObject *sender,QMetaObject *senderMetaObject,QObject *receiver,char *message)

{
  bool bVar1;
  QMessageLogger *pQVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *receiverString;
  char *senderString;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff78;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this;
  char *in_stack_ffffffffffffff88;
  QMessageLogger *pQVar4;
  QMessageLogger local_38;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (undefined8 *)0x0) {
    if (in_RSI == 0) {
      in_stack_ffffffffffffff88 = "Unknown";
      pQVar2 = (QMessageLogger *)in_stack_ffffffffffffff88;
    }
    else {
      in_stack_ffffffffffffff88 = QMetaObject::className((QMetaObject *)in_stack_ffffffffffffff78);
      pQVar2 = (QMessageLogger *)in_stack_ffffffffffffff88;
    }
  }
  else {
    (**(code **)*in_RDI)();
    pQVar2 = (QMessageLogger *)QMetaObject::className((QMetaObject *)in_stack_ffffffffffffff78);
  }
  pQVar4 = pQVar2;
  if (in_RDX == (undefined8 *)0x0) {
    pcVar3 = "Unknown";
  }
  else {
    (**(code **)*in_RDX)();
    pcVar3 = QMetaObject::className((QMetaObject *)in_stack_ffffffffffffff78);
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)pcVar3;
  lcConnect();
  anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (this,in_stack_ffffffffffffff78);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f99a5);
    QMessageLogger::QMessageLogger
              (pQVar4,in_stack_ffffffffffffff88,(int)((ulong)this >> 0x20),
               (char *)in_stack_ffffffffffffff78,(char *)0x3f99bb);
    QMessageLogger::warning(&local_38,"QObject::connect(%s, %s): %s",pQVar2,pcVar3,in_RCX);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void connectWarning(const QObject *sender,
                           const QMetaObject *senderMetaObject,
                           const QObject *receiver,
                           const char *message)
{
    const char *senderString = sender ? sender->metaObject()->className()
                                      : senderMetaObject ? senderMetaObject->className()
                                      : "Unknown";
    const char *receiverString = receiver ? receiver->metaObject()->className()
                                          : "Unknown";
    qCWarning(lcConnect, "QObject::connect(%s, %s): %s", senderString, receiverString, message);
}